

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TexSubImageCubeAlignCase::createTexture(TexSubImageCubeAlignCase *this)

{
  ContextWrapper *this_00;
  int iVar1;
  long lVar2;
  TextureFormat fmt;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  PixelBufferAccess local_50;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  iVar1 = tcu::TextureFormat::getPixelSize(&fmt);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(iVar1 * (this->super_TextureSpecCase).m_width *
                         (this->super_TextureSpecCase).m_height));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_50,&fmt,(this->super_TextureSpecCase).m_width,
             (this->super_TextureSpecCase).m_height,1,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::Vector<float,_4>::Vector(&local_68,0.0);
  tcu::Vector<float,_4>::Vector(&local_78,1.0);
  tcu::fillWithComponentGradients(&local_50,&local_68,&local_78);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    sglr::ContextWrapper::glTexImage2D
              (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar2),0,this->m_format,
               (this->super_TextureSpecCase).m_width,(this->super_TextureSpecCase).m_height,0,
               this->m_format,this->m_dataType,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  iVar1 = getRowPitch(&fmt,this->m_subW,this->m_alignment);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(this->m_subH * iVar1));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_50,&fmt,this->m_subW,this->m_subH,1,iVar1,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_68.m_data[0] = 1.0;
  local_68.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[3] = 1.0;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 1.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 1.0;
  tcu::fillWithGrid(&local_50,4,&local_68,&local_78);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    sglr::ContextWrapper::glTexSubImage2D
              (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar2),0,this->m_subX,this->m_subY,
               this->m_subW,this->m_subH,this->m_format,this->m_dataType,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		deUint32			tex			= 0;
		vector<deUint8>		data;

		DE_ASSERT(m_width == m_height);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		// Specify base level.
		data.resize(fmt.getPixelSize()*m_width*m_height);
		tcu::fillWithComponentGradients(tcu::PixelBufferAccess(fmt, m_width, m_height, 1, &data[0]), Vec4(0.0f), Vec4(1.0f));

		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			glTexImage2D(s_cubeMapFaces[face], 0, m_format, m_width, m_height, 0, m_format, m_dataType, &data[0]);

		// Re-specify subrectangle.
		int rowPitch = getRowPitch(fmt, m_subW, m_alignment);
		data.resize(rowPitch*m_subH);
		tcu::fillWithGrid(tcu::PixelBufferAccess(fmt, m_subW, m_subH, 1, rowPitch, 0, &data[0]), 4, Vec4(1.0f, 0.0f, 0.0f, 1.0f), Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			glTexSubImage2D(s_cubeMapFaces[face], 0, m_subX, m_subY, m_subW, m_subH, m_format, m_dataType, &data[0]);
	}